

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  Arena *arena;
  int iVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  void **ppvVar3;
  void **ppvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *this_00;
  Rep *pRVar6;
  long lVar7;
  int n;
  void **ppvVar8;
  RepeatedPtrFieldBase *local_48 [2];
  RepeatedPtrFieldBase *local_38;
  
  local_48[0] = from;
  local_38 = this;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                          (local_48,&local_38,"&from != this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    n = from->current_size_ + this->current_size_;
    ppvVar3 = InternalReserve(this,n);
    ppvVar4 = elements(from);
    iVar2 = from->current_size_;
    iVar1 = ClearedCount(this);
    if (from->current_size_ < iVar1) {
      iVar1 = from->current_size_;
    }
    for (ppvVar8 = ppvVar4; ppvVar8 < ppvVar4 + iVar1; ppvVar8 = ppvVar8 + 1) {
      std::__cxx11::string::_M_assign((string *)*ppvVar3);
      ppvVar3 = ppvVar3 + 1;
    }
    arena = this->arena_;
    lVar7 = 0;
    if (arena == (Arena *)0x0) {
      for (; (void **)(lVar7 + (long)ppvVar8) < ppvVar4 + iVar2; lVar7 = lVar7 + 8) {
        this_00 = (string *)operator_new(0x20);
        std::__cxx11::string::string(this_00,*(string **)(lVar7 + (long)ppvVar8));
        *(string **)((long)ppvVar3 + lVar7) = this_00;
      }
    }
    else {
      for (; (void **)(lVar7 + (long)ppvVar8) < ppvVar4 + iVar2; lVar7 = lVar7 + 8) {
        pbVar5 = Arena::Create<std::__cxx11::string,std::__cxx11::string&>
                           (arena,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(lVar7 + (long)ppvVar8));
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((long)ppvVar3 + lVar7) = pbVar5;
      }
    }
    this->current_size_ = n;
    iVar2 = allocated_size(this);
    if (iVar2 < n) {
      pRVar6 = rep(this);
      pRVar6->allocated_size = n;
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
             ,0x94,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<std::string>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<std::string**>(InternalReserve(new_size));
  auto src = reinterpret_cast<std::string* const*>(from.elements());
  auto end = src + from.current_size_;
  auto end_assign = src + std::min(ClearedCount(), from.current_size_);
  for (; src < end_assign; ++dst, ++src) {
    (*dst)->assign(**src);
  }
  if (Arena* const arena = arena_) {
    for (; src < end; ++dst, ++src) {
      *dst = Arena::Create<std::string>(arena, **src);
    }
  } else {
    for (; src < end; ++dst, ++src) {
      *dst = new std::string(**src);
    }
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}